

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_int<int,fmt::FormatSpec>
          (BasicWriter<char> *this,int value,FormatSpec spec)

{
  undefined4 uVar1;
  uint uVar2;
  lconv *plVar3;
  size_t __n;
  CharPtr __dest;
  long lVar4;
  byte *pbVar5;
  CharPtr pcVar6;
  ulong uVar7;
  byte bVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ptrdiff_t _Num;
  char in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar15;
  
  uVar1 = spec._20_4_;
  uVar12 = (ulong)(uint)value;
  uVar15 = 0;
  if (value < 0) {
    uVar15 = 0x2d;
    uVar12 = (ulong)(uint)-value;
LAB_00123410:
    uVar13 = 1;
  }
  else {
    uVar13 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      bVar8 = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        bVar8 = 0x20;
      }
      uVar15 = (uint)bVar8;
      goto LAB_00123410;
    }
  }
  uVar2 = (uint)uVar12;
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00123731;
      if (spec.type_ == 'B') {
LAB_00123650:
        uVar15 = uVar13;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffb4)[uVar13] = 0x30;
          uVar15 = uVar13 | 2;
          (&stack0xffffffffffffffb5)[uVar13] = spec.type_;
        }
        uVar13 = 0;
        uVar7 = uVar12;
        do {
          uVar13 = uVar13 + 1;
          uVar2 = (uint)uVar7;
          uVar7 = uVar7 >> 1;
        } while (1 < uVar2);
        pbVar5 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                   (this,uVar13,&spec,&stack0xffffffffffffffb4,uVar15);
        do {
          uVar15 = (uint)uVar12;
          *pbVar5 = (byte)uVar12 & 1 | 0x30;
          pbVar5 = pbVar5 + -1;
          uVar12 = uVar12 >> 1;
        } while (1 < uVar15);
        return;
      }
    }
    else {
      if (spec.type_ == 'X') goto LAB_001236bc;
      if (spec.type_ == 'b') goto LAB_00123650;
    }
code_r0x0012388a:
    internal::report_unknown_type
              (in_stack_ffffffffffffffaf,(char *)CONCAT44(uVar15,in_stack_ffffffffffffffb0));
  }
  if (0x6e < (byte)spec.type_) {
    if (spec.type_ == 'o') {
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        uVar7 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
        (&stack0xffffffffffffffb4)[uVar7] = 0x30;
      }
      uVar15 = 0;
      uVar7 = uVar12;
      do {
        uVar15 = uVar15 + 1;
        uVar2 = (uint)uVar7;
        uVar7 = uVar7 >> 3;
      } while (7 < uVar2);
      pbVar5 = (byte *)prepare_int_buffer<fmt::FormatSpec>
                                 (this,uVar15,&spec,&stack0xffffffffffffffb4,uVar13);
      do {
        uVar15 = (uint)uVar12;
        *pbVar5 = (byte)uVar12 & 7 | 0x30;
        pbVar5 = pbVar5 + -1;
        uVar12 = uVar12 >> 3;
      } while (7 < uVar15);
      return;
    }
    if (spec.type_ == 'x') {
LAB_001236bc:
      uVar15 = uVar13;
      if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
        (&stack0xffffffffffffffb4)[uVar13] = 0x30;
        uVar15 = uVar13 | 2;
        (&stack0xffffffffffffffb5)[uVar13] = spec.type_;
      }
      uVar13 = 0;
      uVar7 = uVar12;
      do {
        uVar13 = uVar13 + 1;
        uVar2 = (uint)uVar7;
        uVar7 = uVar7 >> 4;
      } while (0xf < uVar2);
      pcVar6 = prepare_int_buffer<fmt::FormatSpec>
                         (this,uVar13,&spec,&stack0xffffffffffffffb4,uVar15);
      pcVar9 = "0123456789ABCDEF";
      if (spec.type_ == 'x') {
        pcVar9 = "0123456789abcdef";
      }
      do {
        uVar15 = (uint)uVar12;
        *pcVar6 = pcVar9[uVar15 & 0xf];
        pcVar6 = pcVar6 + -1;
        uVar12 = uVar12 >> 4;
      } while (0xf < uVar15);
      return;
    }
    goto code_r0x0012388a;
  }
  if (spec.type_ == 'd') {
LAB_00123731:
    uVar15 = 0x1f;
    if ((uVar2 | 1) != 0) {
      for (; (uVar2 | 1) >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    uVar15 = (uVar15 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    pcVar6 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar15 - (uVar2 < *(uint *)(internal::BasicData<void>::POWERS_OF_10_32
                                                         + (ulong)uVar15 * 4))) + 1,&spec,
                        &stack0xffffffffffffffb4,uVar13);
    pcVar6 = pcVar6 + 1;
    if (99 < uVar2) {
      do {
        uVar15 = (uint)uVar12;
        uVar2 = (uint)(uVar12 / 100);
        uVar12 = uVar12 / 100;
        *(undefined2 *)(pcVar6 + -2) =
             *(undefined2 *)
              (internal::BasicData<void>::DIGITS + (ulong)(uVar15 + (int)uVar12 * -100) * 2);
        pcVar6 = pcVar6 + -2;
      } while (9999 < uVar15);
    }
    if (uVar2 < 10) {
      bVar8 = (byte)uVar2 | 0x30;
      lVar10 = -1;
    }
    else {
      pcVar6[-1] = internal::BasicData<void>::DIGITS[((ulong)uVar2 * 2 & 0xffffffff) + 1];
      bVar8 = internal::BasicData<void>::DIGITS[(ulong)uVar2 * 2];
      lVar10 = -2;
    }
    pcVar6[lVar10] = bVar8;
    return;
  }
  if (spec.type_ != 'n') goto code_r0x0012388a;
  uVar15 = 0x1f;
  if ((uVar2 | 1) != 0) {
    for (; (uVar2 | 1) >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  uVar15 = (uVar15 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  plVar3 = localeconv();
  pcVar9 = plVar3->thousands_sep;
  __n = strlen(pcVar9);
  uVar15 = uVar15 - (uVar2 < *(uint *)(internal::BasicData<void>::POWERS_OF_10_32 +
                                      (ulong)uVar15 * 4));
  __dest = prepare_int_buffer<fmt::FormatSpec>
                     (this,uVar15 + (int)__n * (uVar15 / 3) + 1,&spec,&stack0xffffffffffffffb4,
                      uVar13);
  pcVar6 = __dest + 1;
  if (uVar2 < 100) {
    if (9 < uVar2) {
      uVar12 = (ulong)(uVar2 * 2);
      *__dest = internal::BasicData<void>::DIGITS[uVar12 + 1];
      goto LAB_00123854;
    }
  }
  else {
    lVar10 = -__n;
    uVar15 = 0;
    do {
      uVar2 = uVar15;
      uVar7 = uVar12;
      uVar13 = (uint)uVar7;
      uVar12 = uVar7 / 100;
      iVar11 = (int)(uVar7 / 100);
      uVar14 = (ulong)((uVar13 + iVar11 * -100) * 2);
      pcVar6[-1] = internal::BasicData<void>::DIGITS[uVar14 + 1];
      if ((uVar2 | 1) * -0x55555555 < 0x55555556) {
        pcVar6 = pcVar6 + lVar10 + -1;
        if (__n == 0) {
          pcVar6[-1] = internal::BasicData<void>::DIGITS[uVar14];
          lVar4 = 0;
          if ((uVar2 + 2) * -0x55555555 < 0x55555556) {
            lVar4 = lVar10;
          }
          pcVar6 = pcVar6 + lVar4 + -1;
        }
        else {
          memmove(pcVar6,pcVar9,__n);
          pcVar6[-1] = internal::BasicData<void>::DIGITS[uVar14];
          pcVar6 = pcVar6 + -1;
          if ((uVar2 + 2) * -0x55555555 < 0x55555556) {
            pcVar6 = pcVar6 + lVar10;
            goto LAB_001235cc;
          }
        }
      }
      else {
        pcVar6[-2] = internal::BasicData<void>::DIGITS[uVar14];
        pcVar6 = pcVar6 + -2;
        if (((uVar2 + 2) * -0x55555555 < 0x55555556) && (pcVar6 = pcVar6 + lVar10, __n != 0)) {
LAB_001235cc:
          memmove(pcVar6,pcVar9,__n);
        }
      }
      uVar15 = uVar2 + 2;
    } while (9999 < uVar13);
    if (999 < uVar13) {
      uVar12 = (ulong)(uint)(iVar11 + (int)(uVar7 / 100));
      __dest = pcVar6 + -1;
      pcVar6[-1] = internal::BasicData<void>::DIGITS[uVar12 + 1];
      if ((uVar2 * -0x55555555 + 1 < 0x55555556) && (__dest = __dest + -__n, __n != 0)) {
        memmove(__dest,pcVar9,__n);
      }
LAB_00123854:
      bVar8 = internal::BasicData<void>::DIGITS[uVar12];
      pcVar6 = __dest;
      goto LAB_00123860;
    }
  }
  bVar8 = (byte)uVar12 | 0x30;
LAB_00123860:
  pcVar6[-1] = bVar8;
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type_prefix();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type_prefix();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#if !(defined(ANDROID) || defined(__ANDROID__))
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}